

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwLibrary.cpp
# Opt level: O1

void __thiscall eglw::DefaultLibrary::DefaultLibrary(DefaultLibrary *this,char *dynamicLibraryName)

{
  Functions *this_00;
  int iVar1;
  DynamicLibrary *pDVar2;
  StaticFunctionLibrary *this_01;
  undefined4 extraout_var;
  CoreLoader loader;
  FunctionLoader local_48;
  StaticFunctionLibrary *local_40;
  DynamicLibrary *local_38;
  deFunctionPtr local_30;
  
  (this->super_FuncPtrLibrary).super_Library._vptr_Library = (_func_int **)&PTR_bindAPI_0215de00;
  this_00 = &(this->super_FuncPtrLibrary).m_egl;
  Functions::Functions(this_00);
  (this->super_FuncPtrLibrary).super_Library._vptr_Library = (_func_int **)&PTR_bindAPI_0215e060;
  this->m_dynLib = (DynamicLibrary *)0x0;
  if (dynamicLibraryName != (char *)0x0) {
    pDVar2 = (DynamicLibrary *)operator_new(8);
    de::DynamicLibrary::DynamicLibrary(pDVar2,dynamicLibraryName);
    this->m_dynLib = pDVar2;
  }
  pDVar2 = this->m_dynLib;
  local_48._vptr_FunctionLoader = (_func_int **)&PTR_get_0215e000;
  this_01 = (StaticFunctionLibrary *)operator_new(0x38);
  tcu::StaticFunctionLibrary::StaticFunctionLibrary
            (this_01,(Entry *)eglw::(anonymous_namespace)::createStaticLibrary()::s_staticEntries,
             0x2c);
  local_30 = (deFunctionPtr)0x0;
  local_40 = this_01;
  local_38 = pDVar2;
  iVar1 = (*(this_01->super_FunctionLibrary)._vptr_FunctionLibrary[2])(this_01,"eglGetProcAddress");
  local_30 = (deFunctionPtr)CONCAT44(extraout_var,iVar1);
  if ((local_30 == (deFunctionPtr)0x0) && (local_38 != (DynamicLibrary *)0x0)) {
    local_30 = deDynamicLibrary_getFunction(local_38->m_library,"eglGetProcAddress");
  }
  initCore(this_00,&local_48);
  local_48._vptr_FunctionLoader = (_func_int **)&PTR_get_0215e000;
  if (local_40 != (StaticFunctionLibrary *)0x0) {
    (*(local_40->super_FunctionLibrary)._vptr_FunctionLibrary[1])();
  }
  local_40 = (StaticFunctionLibrary *)(this->super_FuncPtrLibrary).m_egl.getProcAddress;
  if (local_40 != (StaticFunctionLibrary *)0x0) {
    local_48._vptr_FunctionLoader = (_func_int **)&PTR_get_0215e030;
    initExtensions(this_00,&local_48);
  }
  return;
}

Assistant:

DefaultLibrary::DefaultLibrary (const char* dynamicLibraryName)
	: m_dynLib(DE_NULL)
{
	if (dynamicLibraryName)
		m_dynLib = new de::DynamicLibrary(dynamicLibraryName);

	{
		const CoreLoader loader(m_dynLib);
		initCore(&m_egl, &loader);
	}

	if (m_egl.getProcAddress)
	{
		const ExtLoader loader(m_egl.getProcAddress);
		initExtensions(&m_egl, &loader);
	}
}